

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool testing::internal::MatchPrintAndExplain<std::__cxx11::string_const,std::__cxx11::string_const&>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
               Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *matcher,MatchResultListener *listener)

{
  bool bVar1;
  ostream *poVar2;
  StringMatchResultListener *this;
  MatchResultListener *in_RDX;
  string *type_name;
  bool match;
  StringMatchResultListener inner_listener;
  StringMatchResultListener *in_stack_fffffffffffffd98;
  string *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffdd0;
  string local_218 [32];
  string local_1f8 [32];
  string *local_1d8;
  byte local_1b9;
  MatchResultListener *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  bVar1 = MatchResultListener::IsInterested(in_RDX);
  if (bVar1) {
    StringMatchResultListener::StringMatchResultListener
              ((StringMatchResultListener *)
               CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
    local_1b9 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                ::MatchAndExplain((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                   *)in_stack_fffffffffffffda0,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffd98,(MatchResultListener *)0x21e8df);
    MatchResultListener::stream(local_20);
    UniversalPrint<std::__cxx11::string>
              (in_stack_fffffffffffffda0,(ostream *)in_stack_fffffffffffffd98);
    GetTypeName<std::__cxx11::string_const>();
    local_1d8 = local_1f8;
    bVar1 = IsReadableTypeName(in_stack_fffffffffffffda0);
    if (bVar1) {
      poVar2 = MatchResultListener::stream(local_20);
      poVar2 = std::operator<<(poVar2," (of type ");
      poVar2 = std::operator<<(poVar2,local_1d8);
      std::operator<<(poVar2,")");
    }
    StringMatchResultListener::str_abi_cxx11_(in_stack_fffffffffffffd98);
    this = (StringMatchResultListener *)MatchResultListener::stream(local_20);
    PrintIfNotEmpty((string *)this,(ostream *)in_stack_fffffffffffffd98);
    std::__cxx11::string::~string(local_218);
    local_1 = local_1b9 & 1;
    std::__cxx11::string::~string(local_1f8);
    StringMatchResultListener::~StringMatchResultListener(this);
  }
  else {
    local_1 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::Matches(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool MatchPrintAndExplain(Value& value, const Matcher<T>& matcher,
                          MatchResultListener* listener) {
  if (!listener->IsInterested()) {
    // If the listener is not interested, we do not need to construct the
    // inner explanation.
    return matcher.Matches(value);
  }

  StringMatchResultListener inner_listener;
  const bool match = matcher.MatchAndExplain(value, &inner_listener);

  UniversalPrint(value, listener->stream());
#if GTEST_HAS_RTTI
  const string& type_name = GetTypeName<Value>();
  if (IsReadableTypeName(type_name))
    *listener->stream() << " (of type " << type_name << ")";
#endif
  PrintIfNotEmpty(inner_listener.str(), listener->stream());

  return match;
}